

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

void * Js::JavascriptExceptionOperators::OP_TryFinallyNoOpt
                 (void *tryAddr,void *finallyAddr,void *frame,size_t spillSize,size_t argsSize,
                 ScriptContext *scriptContext)

{
  ThreadContext *this;
  void *pvVar1;
  JavascriptException *err;
  undefined1 local_78 [8];
  TryHandlerAddrOfReturnAddrStack tryHandlerAddrOfReturnAddrStack;
  void *addrOfReturnAddr;
  void *tryHandlerAddrOfReturnAddr;
  JavascriptExceptionObject *exception;
  void *finallyContinuation;
  void *tryContinuation;
  ScriptContext *scriptContext_local;
  size_t argsSize_local;
  size_t spillSize_local;
  void *frame_local;
  void *finallyAddr_local;
  void *tryAddr_local;
  
  this = ScriptContext::GetThreadContext(scriptContext);
  ThreadContext::ProbeStack(this,spillSize + 0x4c00 + argsSize,scriptContext,(PVOID)0x0);
  tryHandlerAddrOfReturnAddrStack.m_threadContext = (ThreadContext *)((long)frame + 8);
  TryHandlerAddrOfReturnAddrStack::TryHandlerAddrOfReturnAddrStack
            ((TryHandlerAddrOfReturnAddrStack *)local_78,scriptContext,
             tryHandlerAddrOfReturnAddrStack.m_threadContext);
  tryAddr_local = (void *)amd64_CallWithFakeFrame(tryAddr,frame,spillSize,argsSize,0);
  TryHandlerAddrOfReturnAddrStack::~TryHandlerAddrOfReturnAddrStack
            ((TryHandlerAddrOfReturnAddrStack *)local_78);
  pvVar1 = (void *)amd64_CallWithFakeFrame(finallyAddr,frame,spillSize,argsSize,0);
  if (pvVar1 != (void *)0x0) {
    tryAddr_local = pvVar1;
  }
  return tryAddr_local;
}

Assistant:

void * JavascriptExceptionOperators::OP_TryFinallyNoOpt(void * tryAddr, void * finallyAddr, void * frame, size_t spillSize, size_t argsSize, ScriptContext * scriptContext)
    {
        void                      *tryContinuation = nullptr;
        void                      *finallyContinuation = nullptr;
        JavascriptExceptionObject *exception           = nullptr;
        void                      *tryHandlerAddrOfReturnAddr = nullptr;

        PROBE_STACK(scriptContext, Constants::MinStackJitEHBailout + spillSize + argsSize);
        {
            void * addrOfReturnAddr = (void*)((char*)frame + sizeof(char*));
            Js::JavascriptExceptionOperators::TryHandlerAddrOfReturnAddrStack tryHandlerAddrOfReturnAddrStack(scriptContext, addrOfReturnAddr);
            try
            {
                tryContinuation = amd64_CallWithFakeFrame(tryAddr, frame, spillSize, argsSize);
            }
            catch (const Js::JavascriptException& err)
            {
                exception = err.GetAndClear();
                tryHandlerAddrOfReturnAddr = scriptContext->GetThreadContext()->GetTryHandlerAddrOfReturnAddr();
            }
        }
        if (exception)
        {
            // Clone static exception object early in case finally block overwrites it
            exception = exception->CloneIfStaticExceptionObject(scriptContext);
#if ENABLE_NATIVE_CODEGEN
            if (exception->GetExceptionContext() && exception->GetExceptionContext()->ThrowingFunction())
            {
                WalkStackForCleaningUpInlineeInfo(scriptContext, nullptr /* start stackwalk from the current frame */, tryHandlerAddrOfReturnAddr);
            }
#endif
        }

        finallyContinuation = amd64_CallWithFakeFrame(finallyAddr, frame, spillSize, argsSize);
        if (finallyContinuation)
        {
            return finallyContinuation;
        }

        if (exception)
        {
#if ENABLE_NATIVE_CODEGEN
            if (scriptContext->GetThreadContext()->GetTryHandlerAddrOfReturnAddr() != nullptr)
            {
                WalkStackForCleaningUpInlineeInfo(scriptContext, nullptr, scriptContext->GetThreadContext()->GetTryHandlerAddrOfReturnAddr());
            }
#endif
            JavascriptExceptionOperators::DoThrow(exception, scriptContext);
        }

        return tryContinuation;
    }